

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void henson_yield(void)

{
  if ((parent != (context_t *)0x0) && (local != (context_t *)0x0)) {
    coro_transfer(local,parent);
  }
  return;
}

Assistant:

__attribute__ ((visibility ("hidden")))
void henson_yield()
{
    if (parent == 0 || local == 0)      // not running under henson; do nothing
        return;

#ifdef USE_BOOST
    *parent = parent->resume();
#else
    coro_transfer(local, parent);
#endif
}